

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

int * Wlc_VecLoadFanins(Vec_Int_t *vOut,int *pFanins,int nFanins,int nTotal,int fSigned)

{
  ulong uVar1;
  int iVar2;
  int Entry;
  ulong uVar3;
  
  if (fSigned == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = pFanins[(long)nFanins + -1];
  }
  vOut->nSize = 0;
  if (nFanins <= nTotal) {
    uVar3 = 0;
    uVar1 = (ulong)(uint)nTotal;
    if (nTotal < 1) {
      uVar1 = uVar3;
    }
    for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      Entry = iVar2;
      if ((long)uVar3 < (long)nFanins) {
        Entry = pFanins[uVar3];
      }
      Vec_IntPush(vOut,Entry);
    }
    return vOut->pArray;
  }
  __assert_fail("nFanins <= nTotal",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                ,0x58,"int *Wlc_VecLoadFanins(Vec_Int_t *, int *, int, int, int)");
}

Assistant:

int * Wlc_VecLoadFanins( Vec_Int_t * vOut, int * pFanins, int nFanins, int nTotal, int fSigned )
{
    int Fill = fSigned ? pFanins[nFanins-1] : 0;
    int i; Vec_IntClear( vOut );
    assert( nFanins <= nTotal );
    for( i = 0; i < nTotal; i++) 
        Vec_IntPush( vOut, i < nFanins ? pFanins[i] : Fill );
    return Vec_IntArray( vOut );
}